

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::DragBehavior(ImRect *frame_bb,ImGuiID id,float *v,float v_speed,float v_min,float v_max,
                        int decimal_precision,float power)

{
  float fVar1;
  ImGuiContext *pIVar2;
  ImU32 fill_col;
  float fVar3;
  float fVar4;
  ImVec2 IVar5;
  float local_a0;
  float local_9c;
  ImGuiCol local_98;
  float v1_sign;
  float v1_abs;
  float v1;
  float v0_sign;
  float v0_abs;
  float delta;
  float speed;
  ImVec2 mouse_drag_delta;
  float v_cur;
  bool local_61;
  bool value_changed;
  ImU32 frame_col;
  ImGuiStyle *style;
  ImGuiContext *g;
  float power_local;
  int decimal_precision_local;
  float v_max_local;
  float v_min_local;
  float v_speed_local;
  float *v_local;
  ImGuiID id_local;
  ImRect *frame_bb_local;
  
  pIVar2 = GImGui;
  if (GImGui->ActiveId == id) {
    local_98 = 9;
  }
  else {
    local_98 = 7;
    if (GImGui->HoveredId == id) {
      local_98 = 8;
    }
  }
  fill_col = GetColorU32(local_98,1.0);
  RenderFrame(frame_bb->Min,frame_bb->Max,fill_col,true,(pIVar2->Style).FrameRounding);
  local_61 = false;
  if (pIVar2->ActiveId == id) {
    if (((pIVar2->IO).MouseDown[0] & 1U) == 0) {
      SetActiveID(0,(ImGuiWindow *)0x0);
    }
    else {
      if ((pIVar2->ActiveIdIsJustActivated & 1U) != 0) {
        pIVar2->DragCurrentValue = *v;
        ImVec2::ImVec2((ImVec2 *)&mouse_drag_delta.y,0.0,0.0);
        pIVar2->DragLastMouseDelta = stack0xffffffffffffff94;
      }
      mouse_drag_delta.x = pIVar2->DragCurrentValue;
      IVar5 = GetMouseDragDelta(0,1.0);
      delta = IVar5.x;
      if (0.0 < ABS(delta - (pIVar2->DragLastMouseDelta).x)) {
        v0_abs = v_speed;
        if ((((v_speed == 0.0) && (!NAN(v_speed))) &&
            ((v_max - v_min != 0.0 || (NAN(v_max - v_min))))) && (v_max - v_min < 3.4028235e+38)) {
          v0_abs = (v_max - v_min) * pIVar2->DragSpeedDefaultRatio;
        }
        if ((((pIVar2->IO).KeyShift & 1U) != 0) && (0.0 <= pIVar2->DragSpeedScaleFast)) {
          v0_abs = v0_abs * pIVar2->DragSpeedScaleFast;
        }
        if ((((pIVar2->IO).KeyAlt & 1U) != 0) && (0.0 <= pIVar2->DragSpeedScaleSlow)) {
          v0_abs = v0_abs * pIVar2->DragSpeedScaleSlow;
        }
        fVar3 = (delta - (pIVar2->DragLastMouseDelta).x) * v0_abs;
        if (ABS(power - 1.0) <= 0.001) {
          mouse_drag_delta.x = fVar3 + mouse_drag_delta.x;
        }
        else {
          if (mouse_drag_delta.x < 0.0) {
            local_9c = -mouse_drag_delta.x;
          }
          else {
            local_9c = mouse_drag_delta.x;
          }
          fVar1 = (float)(~-(uint)(0.0 <= mouse_drag_delta.x) & 0xbf800000 |
                         -(uint)(0.0 <= mouse_drag_delta.x) & 0x3f800000);
          fVar4 = powf(local_9c,1.0 / power);
          fVar4 = fVar3 * fVar1 + fVar4;
          local_a0 = fVar4;
          if (fVar4 < 0.0) {
            local_a0 = -fVar4;
          }
          fVar3 = powf(local_a0,power);
          mouse_drag_delta.x =
               fVar3 * fVar1 *
               (float)(~-(uint)(0.0 <= fVar4) & 0xbf800000 | -(uint)(0.0 <= fVar4) & 0x3f800000);
        }
        (pIVar2->DragLastMouseDelta).x = delta;
        if (v_min < v_max) {
          mouse_drag_delta.x = ImClamp(mouse_drag_delta.x,v_min,v_max);
        }
        pIVar2->DragCurrentValue = mouse_drag_delta.x;
      }
      fVar3 = RoundScalar(mouse_drag_delta.x,decimal_precision);
      if ((*v != fVar3) || (NAN(*v) || NAN(fVar3))) {
        *v = fVar3;
        local_61 = true;
      }
    }
  }
  return local_61;
}

Assistant:

bool ImGui::DragBehavior(const ImRect& frame_bb, ImGuiID id, float* v, float v_speed, float v_min, float v_max, int decimal_precision, float power)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    // Draw frame
    const ImU32 frame_col = GetColorU32(g.ActiveId == id ? ImGuiCol_FrameBgActive : g.HoveredId == id ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg);
    RenderFrame(frame_bb.Min, frame_bb.Max, frame_col, true, style.FrameRounding);

    bool value_changed = false;

    // Process clicking on the drag
    if (g.ActiveId == id)
    {
        if (g.IO.MouseDown[0])
        {
            if (g.ActiveIdIsJustActivated)
            {
                // Lock current value on click
                g.DragCurrentValue = *v;
                g.DragLastMouseDelta = ImVec2(0.f, 0.f);
            }

            float v_cur = g.DragCurrentValue;
            const ImVec2 mouse_drag_delta = GetMouseDragDelta(0, 1.0f);
            if (fabsf(mouse_drag_delta.x - g.DragLastMouseDelta.x) > 0.0f)
            {
                float speed = v_speed;
                if (speed == 0.0f && (v_max - v_min) != 0.0f && (v_max - v_min) < FLT_MAX)
                    speed = (v_max - v_min) * g.DragSpeedDefaultRatio;
                if (g.IO.KeyShift && g.DragSpeedScaleFast >= 0.0f)
                    speed = speed * g.DragSpeedScaleFast;
                if (g.IO.KeyAlt && g.DragSpeedScaleSlow >= 0.0f)
                    speed = speed * g.DragSpeedScaleSlow;

                float delta = (mouse_drag_delta.x - g.DragLastMouseDelta.x) * speed;
                if (fabsf(power - 1.0f) > 0.001f)
                {
                    // Logarithmic curve on both side of 0.0
                    float v0_abs = v_cur >= 0.0f ? v_cur : -v_cur;
                    float v0_sign = v_cur >= 0.0f ? 1.0f : -1.0f;
                    float v1 = powf(v0_abs, 1.0f / power) + (delta * v0_sign);
                    float v1_abs = v1 >= 0.0f ? v1 : -v1;
                    float v1_sign = v1 >= 0.0f ? 1.0f : -1.0f;          // Crossed sign line
                    v_cur = powf(v1_abs, power) * v0_sign * v1_sign;    // Reapply sign
                }
                else
                {
                    v_cur += delta;
                }
                g.DragLastMouseDelta.x = mouse_drag_delta.x;

                // Clamp
                if (v_min < v_max)
                    v_cur = ImClamp(v_cur, v_min, v_max);
                g.DragCurrentValue = v_cur;
            }

            // Round to user desired precision, then apply
            v_cur = RoundScalar(v_cur, decimal_precision);
            if (*v != v_cur)
            {
                *v = v_cur;
                value_changed = true;
            }
        }
        else
        {
            SetActiveID(0);
        }
    }

    return value_changed;
}